

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  MRef MVar1;
  uint64_t uVar2;
  TValue *pTVar3;
  MRef MVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  GCobj *o;
  MRef MVar7;
  
  pTVar3 = &hashkey(t,key)->val;
  if ((pTVar3->u64 != 0xffffffffffffffff) || (t->hmask == 0)) {
    MVar7.ptr64 = (t->freetop).ptr64;
    MVar1.ptr64 = MVar7.ptr64;
    do {
      pTVar5 = (TValue *)MVar1.ptr64;
      if (pTVar5 == (TValue *)(t->node).ptr64) {
        rehashtab(L,t,key);
        pTVar3 = lj_tab_set(L,t,key);
        return pTVar3;
      }
      MVar1.ptr64 = (uint64_t)(pTVar5 + -3);
      MVar7.ptr64 = MVar7.ptr64 + -0x18;
    } while (pTVar5[-2].u64 != 0xffffffffffffffff);
    (t->freetop).ptr64 = MVar7.ptr64;
    MVar4.ptr64 = (uint64_t)hashkey(t,pTVar3 + 1);
    if ((TValue *)MVar4.ptr64 == pTVar3) {
      pTVar5[-1] = pTVar3[2];
      pTVar3[2].u64 = MVar7.ptr64;
      pTVar3 = (TValue *)MVar1.ptr64;
    }
    else {
      do {
        pTVar6 = (TValue *)MVar4.ptr64;
        MVar4.ptr64 = pTVar6[2].u64;
      } while (pTVar3 != (TValue *)MVar4.ptr64);
      pTVar6[2].u64 = MVar7.ptr64;
      (((TValue *)&((GCRef *)MVar1.ptr64)->gcptr64)->gcr).gcptr64 =
           ((uint64_t)*(GCRef *)pTVar3).gcptr64;
      pTVar5[-2] = pTVar3[1];
      pTVar5[-1] = pTVar3[2];
      pTVar3[2].u64 = 0;
      pTVar3->u64 = 0xffffffffffffffff;
      do {
        MVar7.ptr64 = MVar1.ptr64;
        MVar1.ptr64 = ((TValue *)(MVar7.ptr64 + 0x10))->u64;
        if ((long *)MVar1.ptr64 == (long *)0x0) goto LAB_001267d1;
      } while ((*(long *)MVar1.ptr64 == -1) ||
              (pTVar5 = &hashkey(t,(cTValue *)(MVar1.ptr64 + 8))->val, pTVar5 != pTVar3));
      *(TValue *)(MVar7.ptr64 + 0x10) = *(TValue *)(MVar1.ptr64 + 0x10);
      *(TValue *)(MVar1.ptr64 + 0x10) = pTVar3[2];
      pTVar3[2].u64 = MVar1.ptr64;
      while (pTVar5 = (TValue *)MVar7.ptr64, MVar7.ptr64 = pTVar5[2].u64,
            (long *)MVar7.ptr64 != (long *)0x0) {
        if (((*(long *)MVar7.ptr64 != -1) &&
            (pTVar6 = &hashkey(t,(cTValue *)(MVar7.ptr64 + 8))->val, pTVar6 != pTVar5)) &&
           (pTVar6 != (TValue *)MVar7.ptr64)) {
          pTVar5[2] = *(TValue *)(MVar7.ptr64 + 0x10);
          *(TValue *)(MVar7.ptr64 + 0x10) = pTVar6[2];
          pTVar6[2].u64 = MVar7.ptr64;
          MVar7.ptr64 = (uint64_t)pTVar5;
        }
      }
    }
  }
LAB_001267d1:
  pTVar3[1] = *key;
  if ((t->marked & 4) != 0) {
    uVar2 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar2 + 0x40);
    *(GCtab **)(uVar2 + 0x40) = t;
  }
  return pTVar3;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = getfreetop(t, nodebase);
    lj_assertL(freenode >= nodebase && freenode <= nodebase+t->hmask+1,
	       "bad freenode");
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setfreetop(t, nodebase, freenode);
    lj_assertL(freenode != &G(L)->nilnode, "store to fallback hash");
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /* Rechain pseudo-resurrected string keys with colliding hashes. */
      while (nextnode(freenode)) {
	Node *nn = nextnode(freenode);
	if (!tvisnil(&nn->val) && hashkey(t, &nn->key) == n) {
	  freenode->next = nn->next;
	  nn->next = n->next;
	  setmref(n->next, nn);
	  /*
	  ** Rechaining a resurrected string key creates a new dilemma:
	  ** Another string key may have originally been resurrected via
	  ** _any_ of the previous nodes as a chain anchor. Including
	  ** a node that had to be moved, which makes them unreachable.
	  ** It's not feasible to check for all previous nodes, so rechain
	  ** any string key that's currently in a non-main positions.
	  */
	  while ((nn = nextnode(freenode))) {
	    if (!tvisnil(&nn->val)) {
	      Node *mn = hashkey(t, &nn->key);
	      if (mn != freenode && mn != nn) {
		freenode->next = nn->next;
		nn->next = mn->next;
		setmref(mn->next, nn);
	      } else {
		freenode = nn;
	      }
	    } else {
	      freenode = nn;
	    }
	  }
	  break;
	} else {
	  freenode = nn;
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lj_assertL(tvisnil(&n->val), "new hash slot is not empty");
  return &n->val;
}